

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderSourceSplitCase::ShaderSourceSplitCase
          (ShaderSourceSplitCase *this,Context *context,char *name,char *desc,ShaderType shaderType,
          int numSlices,deUint32 flags)

{
  deUint32 dVar1;
  char *str;
  int numSlices_local;
  ShaderType shaderType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ShaderSourceSplitCase *this_local;
  
  ApiCase::ApiCase(&this->super_ApiCase,context,name,desc);
  (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderSourceSplitCase_03287d78;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random(&this->m_rnd,dVar1 ^ 0x4fb2337d);
  this->m_shaderType = shaderType;
  this->m_numSlices = numSlices;
  this->m_explicitLengths = (flags & 1) != 0;
  this->m_randomNullTerm = (flags & 2) != 0;
  return;
}

Assistant:

ShaderSourceSplitCase (Context& context, const char* name, const char* desc, glu::ShaderType shaderType, const int numSlices, const deUint32 flags = 0)
		: ApiCase			(context, name, desc)
		, m_rnd				(deStringHash(getName()) ^ 0x4fb2337d)
		, m_shaderType		(shaderType)
		, m_numSlices		(numSlices)
		, m_explicitLengths	((flags & CASE_EXPLICIT_SOURCE_LENGTHS)	!= 0)
		, m_randomNullTerm	((flags & CASE_RANDOM_NULL_TERMINATED)	!= 0)
	{
		DE_ASSERT(m_shaderType == glu::SHADERTYPE_VERTEX || m_shaderType == glu::SHADERTYPE_FRAGMENT);
	}